

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrint(ConsoleReporter *this)

{
  ConsoleReporter *this_local;
  
  if (((this->super_StreamingReporterBase).currentTestRunInfo.used & 1U) == 0) {
    lazyPrintRunInfo(this);
  }
  if (((this->super_StreamingReporterBase).currentGroupInfo.used & 1U) == 0) {
    lazyPrintGroupInfo(this);
  }
  if (((this->super_StreamingReporterBase).field_0x1e9 & 1) == 0) {
    printTestCaseAndSectionHeader(this);
    (this->super_StreamingReporterBase).field_0x1e9 = 1;
  }
  return;
}

Assistant:

void lazyPrint() {

            if( !currentTestRunInfo.used )
                lazyPrintRunInfo();
            if( !currentGroupInfo.used )
                lazyPrintGroupInfo();

            if( !m_headerPrinted ) {
                printTestCaseAndSectionHeader();
                m_headerPrinted = true;
            }
        }